

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

OPJ_BOOL opj_j2k_read_cbd(opj_j2k_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                         opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 OVar1;
  undefined8 in_RAX;
  OPJ_UINT32 *pOVar2;
  ulong uVar3;
  OPJ_UINT32 l_comp_def;
  OPJ_UINT32 l_nb_comp;
  undefined8 local_38;
  
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x18e4,
                  "OPJ_BOOL opj_j2k_read_cbd(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k != (opj_j2k_t *)0x0) {
    if (p_manager == (opj_event_mgr_t *)0x0) {
      __assert_fail("p_manager != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                    ,0x18e6,
                    "OPJ_BOOL opj_j2k_read_cbd(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                   );
    }
    OVar1 = p_j2k->m_private_image->numcomps;
    if (OVar1 + 2 == p_header_size) {
      local_38 = in_RAX;
      opj_read_bytes_LE(p_header_data,(OPJ_UINT32 *)((long)&local_38 + 4),2);
      if (local_38._4_4_ == OVar1) {
        if (OVar1 != 0) {
          pOVar2 = &p_j2k->m_private_image->comps->sgnd;
          uVar3 = 0;
          do {
            opj_read_bytes_LE(p_header_data + uVar3 + 2,(OPJ_UINT32 *)&local_38,1);
            *pOVar2 = (uint)local_38 >> 7 & 1;
            pOVar2[-2] = ((uint)local_38 & 0x7f) + 1;
            if (0x1e < ((uint)local_38 & 0x7f)) {
              opj_event_msg(p_manager,1,
                            "Invalid values for comp = %d : prec=%u (should be between 1 and 38 according to the JPEG2000 norm. OpenJpeg only supports up to 31)\n"
                            ,uVar3 & 0xffffffff);
              return 0;
            }
            pOVar2 = pOVar2 + 0x10;
            uVar3 = uVar3 + 1;
          } while (OVar1 != (OPJ_UINT32)uVar3);
        }
        return 1;
      }
    }
    opj_event_msg(p_manager,1,"Crror reading CBD marker\n");
    return 0;
  }
  __assert_fail("p_j2k != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0x18e5,
                "OPJ_BOOL opj_j2k_read_cbd(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)")
  ;
}

Assistant:

static OPJ_BOOL opj_j2k_read_cbd(opj_j2k_t *p_j2k,
                                 OPJ_BYTE * p_header_data,
                                 OPJ_UINT32 p_header_size,
                                 opj_event_mgr_t * p_manager
                                )
{
    OPJ_UINT32 l_nb_comp, l_num_comp;
    OPJ_UINT32 l_comp_def;
    OPJ_UINT32 i;
    opj_image_comp_t * l_comp = 00;

    /* preconditions */
    assert(p_header_data != 00);
    assert(p_j2k != 00);
    assert(p_manager != 00);

    l_num_comp = p_j2k->m_private_image->numcomps;

    if (p_header_size != (p_j2k->m_private_image->numcomps + 2)) {
        opj_event_msg(p_manager, EVT_ERROR, "Crror reading CBD marker\n");
        return OPJ_FALSE;
    }

    opj_read_bytes(p_header_data, &l_nb_comp,
                   2);                           /* Ncbd */
    p_header_data += 2;

    if (l_nb_comp != l_num_comp) {
        opj_event_msg(p_manager, EVT_ERROR, "Crror reading CBD marker\n");
        return OPJ_FALSE;
    }

    l_comp = p_j2k->m_private_image->comps;
    for (i = 0; i < l_num_comp; ++i) {
        opj_read_bytes(p_header_data, &l_comp_def,
                       1);                  /* Component bit depth */
        ++p_header_data;
        l_comp->sgnd = (l_comp_def >> 7) & 1;
        l_comp->prec = (l_comp_def & 0x7f) + 1;

        if (l_comp->prec > 31) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Invalid values for comp = %d : prec=%u (should be between 1 and 38 according to the JPEG2000 norm. OpenJpeg only supports up to 31)\n",
                          i, l_comp->prec);
            return OPJ_FALSE;
        }
        ++l_comp;
    }

    return OPJ_TRUE;
}